

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_scan.c
# Opt level: O3

int IN_SCANSET(char *scanlist,char *end_scanlist,int rc)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  if (scanlist != end_scanlist) {
    uVar2 = 0xffffffff;
    do {
      bVar1 = *scanlist;
      if (uVar2 == 0xffffffff || bVar1 != 0x2d) {
        uVar2 = (uint)bVar1;
        if ((uint)bVar1 == rc) {
          return 1;
        }
      }
      else {
        if ((byte *)scanlist + 1 == (byte *)end_scanlist) {
          return (int)(rc == 0x2d);
        }
        uVar3 = (uint)((byte *)scanlist)[1];
        uVar4 = uVar3 - uVar2;
        if (uVar3 < uVar2) {
          uVar4 = 0;
        }
        uVar3 = ~uVar2;
        uVar2 = 0xffffffff;
        if (uVar3 + rc < uVar4) {
          return 1;
        }
      }
      scanlist = (char *)((byte *)scanlist + 1);
    } while (scanlist != end_scanlist);
  }
  return 0;
}

Assistant:

static int IN_SCANSET( const char * scanlist, const char * end_scanlist, int rc )
{
    /* SOLAR */
    int previous = -1;

    while ( scanlist != end_scanlist )
    {
        if ( ( *scanlist == '-' ) && ( previous != -1 ) )
        {
            /* possible scangroup ("a-z") */
            if ( ++scanlist == end_scanlist )
            {
                /* '-' at end of scanlist does not describe a scangroup */
                return rc == '-';
            }

            while ( ++previous <= ( unsigned char )*scanlist )
            {
                if ( previous == rc )
                {
                    return 1;
                }
            }

            previous = -1;
        }
        else
        {
            /* not a scangroup, check verbatim */
            if ( rc == ( unsigned char )*scanlist )
            {
                return 1;
            }

            previous = ( unsigned char )( *scanlist++ );
        }
    }

    return 0;
}